

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_sign(mbedtls_ecp_group *grp,mbedtls_mpi *r,mbedtls_mpi *s,mbedtls_mpi *d,
                      uchar *buf,size_t blen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  ulong size;
  bool bVar2;
  size_t n_size;
  mbedtls_mpi t;
  mbedtls_mpi e;
  mbedtls_mpi k;
  mbedtls_ecp_point R;
  int blind_tries;
  int sign_tries;
  int key_tries;
  int ret;
  size_t blen_local;
  uchar *buf_local;
  mbedtls_mpi *d_local;
  mbedtls_mpi *s_local;
  mbedtls_mpi *r_local;
  mbedtls_ecp_group *grp_local;
  
  if ((grp->N).p == (mbedtls_mpi_uint *)0x0) {
    grp_local._4_4_ = -0x4f80;
  }
  else {
    mbedtls_ecp_point_init((mbedtls_ecp_point *)&k.p);
    mbedtls_mpi_init((mbedtls_mpi *)&e.p);
    mbedtls_mpi_init((mbedtls_mpi *)&t.p);
    mbedtls_mpi_init((mbedtls_mpi *)&n_size);
    R.Z.p._4_4_ = 0;
    do {
      blind_tries = 0;
      do {
        sign_tries = mbedtls_ecp_gen_keypair
                               (grp,(mbedtls_mpi *)&e.p,(mbedtls_ecp_point *)&k.p,f_rng,p_rng);
        if ((sign_tries != 0) ||
           (sign_tries = mbedtls_mpi_mod_mpi(r,(mbedtls_mpi *)&k.p,&grp->N), sign_tries != 0))
        goto LAB_0013cc3f;
        if (10 < blind_tries) {
          sign_tries = -0x4d00;
          goto LAB_0013cc3f;
        }
        iVar1 = mbedtls_mpi_cmp_int(r,0);
        blind_tries = blind_tries + 1;
      } while (iVar1 == 0);
      sign_tries = derive_mpi(grp,(mbedtls_mpi *)&t.p,buf,blen);
      if (sign_tries != 0) break;
      R.Z.p._0_4_ = 0;
      do {
        size = grp->nbits + 7 >> 3;
        sign_tries = mbedtls_mpi_fill_random((mbedtls_mpi *)&n_size,size,f_rng,p_rng);
        if ((sign_tries != 0) ||
           (sign_tries = mbedtls_mpi_shift_r((mbedtls_mpi *)&n_size,size * 8 - grp->nbits),
           sign_tries != 0)) goto LAB_0013cc3f;
        R.Z.p._0_4_ = (int)R.Z.p + 1;
        if (0x1e < (int)R.Z.p) {
          return -0x4d00;
        }
        iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&n_size,1);
        bVar2 = true;
        if (-1 < iVar1) {
          iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&n_size,&grp->N);
          bVar2 = -1 < iVar1;
        }
      } while (bVar2);
      sign_tries = mbedtls_mpi_mul_mpi(s,r,d);
      if ((((sign_tries != 0) ||
           (sign_tries = mbedtls_mpi_add_mpi((mbedtls_mpi *)&t.p,(mbedtls_mpi *)&t.p,s),
           sign_tries != 0)) ||
          (sign_tries = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&t.p,(mbedtls_mpi *)&t.p,
                                            (mbedtls_mpi *)&n_size), sign_tries != 0)) ||
         (((sign_tries = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&e.p,(mbedtls_mpi *)&e.p,
                                             (mbedtls_mpi *)&n_size), sign_tries != 0 ||
           (sign_tries = mbedtls_mpi_inv_mod(s,(mbedtls_mpi *)&e.p,&grp->N), sign_tries != 0)) ||
          ((sign_tries = mbedtls_mpi_mul_mpi(s,s,(mbedtls_mpi *)&t.p), sign_tries != 0 ||
           (sign_tries = mbedtls_mpi_mod_mpi(s,s,&grp->N), sign_tries != 0)))))) break;
      if (10 < R.Z.p._4_4_) {
        sign_tries = -0x4d00;
        break;
      }
      iVar1 = mbedtls_mpi_cmp_int(s,0);
      R.Z.p._4_4_ = R.Z.p._4_4_ + 1;
    } while (iVar1 == 0);
LAB_0013cc3f:
    mbedtls_ecp_point_free((mbedtls_ecp_point *)&k.p);
    mbedtls_mpi_free((mbedtls_mpi *)&e.p);
    mbedtls_mpi_free((mbedtls_mpi *)&t.p);
    mbedtls_mpi_free((mbedtls_mpi *)&n_size);
    grp_local._4_4_ = sign_tries;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecdsa_sign( mbedtls_ecp_group *grp, mbedtls_mpi *r, mbedtls_mpi *s,
                const mbedtls_mpi *d, const unsigned char *buf, size_t blen,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret, key_tries, sign_tries, blind_tries;
    mbedtls_ecp_point R;
    mbedtls_mpi k, e, t;

    /* Fail cleanly on curves such as Curve25519 that can't be used for ECDSA */
    if( grp->N.p == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    mbedtls_ecp_point_init( &R );
    mbedtls_mpi_init( &k ); mbedtls_mpi_init( &e ); mbedtls_mpi_init( &t );

    sign_tries = 0;
    do
    {
        /*
         * Steps 1-3: generate a suitable ephemeral keypair
         * and set r = xR mod n
         */
        key_tries = 0;
        do
        {
            MBEDTLS_MPI_CHK( mbedtls_ecp_gen_keypair( grp, &k, &R, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( r, &R.X, &grp->N ) );

            if( key_tries++ > 10 )
            {
                ret = MBEDTLS_ERR_ECP_RANDOM_FAILED;
                goto cleanup;
            }
        }
        while( mbedtls_mpi_cmp_int( r, 0 ) == 0 );

        /*
         * Step 5: derive MPI from hashed message
         */
        MBEDTLS_MPI_CHK( derive_mpi( grp, &e, buf, blen ) );

        /*
         * Generate a random value to blind inv_mod in next step,
         * avoiding a potential timing leak.
         */
        blind_tries = 0;
        do
        {
            size_t n_size = ( grp->nbits + 7 ) / 8;
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &t, n_size, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &t, 8 * n_size - grp->nbits ) );

            /* See mbedtls_ecp_gen_keypair() */
            if( ++blind_tries > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
        }
        while( mbedtls_mpi_cmp_int( &t, 1 ) < 0 ||
               mbedtls_mpi_cmp_mpi( &t, &grp->N ) >= 0 );

        /*
         * Step 6: compute s = (e + r * d) / k = t (e + rd) / (kt) mod n
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( s, r, d ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &e, &e, s ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &e, &e, &t ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &k, &k, &t ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( s, &k, &grp->N ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( s, s, &e ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( s, s, &grp->N ) );

        if( sign_tries++ > 10 )
        {
            ret = MBEDTLS_ERR_ECP_RANDOM_FAILED;
            goto cleanup;
        }
    }
    while( mbedtls_mpi_cmp_int( s, 0 ) == 0 );

cleanup:
    mbedtls_ecp_point_free( &R );
    mbedtls_mpi_free( &k ); mbedtls_mpi_free( &e ); mbedtls_mpi_free( &t );

    return( ret );
}